

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::StringUtilTest_IsEqualNoCase_Test::TestBody
          (StringUtilTest_IsEqualNoCase_Test *this)

{
  bool bVar1;
  char *in_R9;
  pointer *__ptr;
  string_view str1;
  string_view str1_00;
  string_view str1_01;
  string_view str1_02;
  string_view str1_03;
  string_view str1_04;
  string_view str2;
  string_view str2_00;
  string_view str2_01;
  string_view str2_02;
  string_view str2_03;
  string_view str2_04;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  local_40[0] = (internal)
                string_util::IsEqualNoCase
                          ((string_view)(ZEXT816(0x5834d0) << 0x40),
                           (string_view)(ZEXT816(0x5834d0) << 0x40));
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"bssl::string_util::IsEqualNoCase(\"\", \"\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x1f,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  str1._M_str = "mail.google.com";
  str1._M_len = 0xf;
  str2._M_str = "maIL.GOoGlE.cOm";
  str2._M_len = 0xf;
  local_40[0] = (internal)string_util::IsEqualNoCase(str1,str2);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail.google.com\", \"maIL.GOoGlE.cOm\")","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x21,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  str1_00._M_str = "MAil~-.google.cOm";
  str1_00._M_len = 0x11;
  str2_00._M_str = "maIL~-.gOoGlE.CoM";
  str2_00._M_len = 0x11;
  local_40[0] = (internal)string_util::IsEqualNoCase(str1_00,str2_00);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"MAil~-.google.cOm\", \"maIL~-.gOoGlE.CoM\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x23,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  str1_01._M_str = anon_var_dwarf_9401a1;
  str1_01._M_len = 0x10;
  str2_01._M_str = anon_var_dwarf_9401ab;
  str2_01._M_len = 0x10;
  local_40[0] = (internal)string_util::IsEqualNoCase(str1_01,str2_01);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail\\x80.google.com\", \"maIL\\x80.GOoGlE.cOm\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x25,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  str1_02._M_str = anon_var_dwarf_9401cb;
  str1_02._M_len = 0x10;
  str2_02._M_str = anon_var_dwarf_9401d5;
  str2_02._M_len = 0x10;
  local_40[0] = (internal)string_util::IsEqualNoCase(str1_02,str2_02);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail\\xFF.google.com\", \"maIL\\xFF.GOoGlE.cOm\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x27,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  str1_03._M_str = "mail.google.co";
  str1_03._M_len = 0xe;
  str2_03._M_str = "maIL.GOoGlE.cOm";
  str2_03._M_len = 0xf;
  bVar1 = string_util::IsEqualNoCase(str1_03,str2_03);
  local_40[0] = (internal)!bVar1;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail.google.co\", \"maIL.GOoGlE.cOm\")","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x29,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  str1_04._M_str = "mail.google.com";
  str1_04._M_len = 0xf;
  str2_04._M_str = "maIL.GOoGlE.cO";
  str2_04._M_len = 0xe;
  bVar1 = string_util::IsEqualNoCase(str1_04,str2_04);
  local_40[0] = (internal)!bVar1;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "bssl::string_util::IsEqualNoCase(\"mail.google.com\", \"maIL.GOoGlE.cO\")","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/string_util_unittest.cc"
               ,0x2b,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST(StringUtilTest, IsEqualNoCase) {
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("", ""));
  EXPECT_TRUE(
      bssl::string_util::IsEqualNoCase("mail.google.com", "maIL.GOoGlE.cOm"));
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("MAil~-.google.cOm",
                                               "maIL~-.gOoGlE.CoM"));
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("mail\x80.google.com",
                                               "maIL\x80.GOoGlE.cOm"));
  EXPECT_TRUE(bssl::string_util::IsEqualNoCase("mail\xFF.google.com",
                                               "maIL\xFF.GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::IsEqualNoCase("mail.google.co", "maIL.GOoGlE.cOm"));
  EXPECT_FALSE(
      bssl::string_util::IsEqualNoCase("mail.google.com", "maIL.GOoGlE.cO"));
}